

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printDisplayLine(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool force,bool forceHead)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  Type TVar3;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  byte in_DL;
  byte in_SIL;
  time_t *__timer;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc90;
  double in_stack_fffffffffffffc98;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffca0;
  undefined1 local_274 [56];
  int local_23c;
  undefined1 local_238 [56];
  int local_200;
  undefined1 local_1fc [56];
  int local_1c4;
  undefined1 local_1c0 [56];
  int local_188;
  int local_184;
  undefined8 local_180;
  undefined1 local_178 [56];
  undefined8 local_140;
  undefined1 local_138 [56];
  undefined1 local_100 [56];
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  undefined4 local_b4;
  Verbosity local_b0;
  byte local_aa;
  byte local_a9;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_a9 = in_SIL & 1;
  local_aa = in_DL & 1;
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar2 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar2)) {
    local_b0 = SPxOut::getVerbosity(in_RDI->spxout);
    local_b4 = 3;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_b4);
    if (((local_aa & 1) != 0) || (in_RDI->displayLine % (in_RDI->displayFreq * 0x1e) == 0)) {
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (-1 < in_RDI->printBasisMetric) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    if ((((local_a9 & 1) != 0) || (in_RDI->displayLine % in_RDI->displayFreq == 0)) &&
       ((local_aa & 1) == 0)) {
      TVar3 = type(in_RDI);
      if (TVar3 == LEAVE) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      else {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (_func_ios_base_ptr_ios_base_ptr *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_b8 = (int)std::setw(7);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setw)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      local_bc = (int)std::setprecision(1);
      __timer = (time_t *)(ulong)(uint)local_bc;
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      time(in_RDI,__timer);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (double)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (_func_ios_base_ptr_ios_base_ptr *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_c0 = (int)std::setprecision(2);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      local_c4 = (int)std::setw(8);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setw)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::iteration(&in_RDI->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 );
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_c8 = (int)std::setw(5);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setw)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      pSVar4 = slinSolver(in_RDI);
      (*pSVar4->_vptr_SLinSolver[0xb])();
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6d])(local_100);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_140 = 0;
      local_30 = &in_RDI->m_pricingViol;
      local_38 = &in_RDI->m_pricingViolCo;
      local_28 = local_178;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30,local_38);
      local_20 = local_178;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffc90);
      local_8 = local_178;
      local_10 = local_30;
      local_18 = local_38;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffffc90,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (cpp_dec_float<50U,_int,_void> *)0x31a252);
      tVar1 = boost::multiprecision::operator>
                        ((double *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x31a267);
      if (tVar1) {
        local_180 = 0;
        local_90 = local_138;
        local_98 = &local_180;
        local_a0 = 0;
        local_88 = local_98;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      }
      else {
        local_70 = &in_RDI->m_pricingViol;
        local_78 = &in_RDI->m_pricingViolCo;
        local_68 = local_138;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,local_78);
        local_60 = local_138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffffc90);
        local_48 = local_138;
        local_50 = local_70;
        local_58 = local_78;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_stack_fffffffffffffc90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                   (cpp_dec_float<50U,_int,_void> *)0x31a396);
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_184 = (int)std::setw(8);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (_Setw)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_188 = (int)std::setprecision(8);
      this_00 = (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)soplex::operator<<((SPxOut *)
                                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                      (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20)
                                     );
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x5e])(local_1c0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (in_RDI->printBasisMetric == 0) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (_func_ios_base_ptr_ios_base_ptr *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_1c4 = (int)std::setprecision(2);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        (*(in_RDI->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x68])(local_1fc,in_RDI,0);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      if (in_RDI->printBasisMetric == 1) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (_func_ios_base_ptr_ios_base_ptr *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_200 = (int)std::setprecision(2);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        (*(in_RDI->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x68])(local_238,in_RDI,1);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      if (in_RDI->printBasisMetric == 2) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (_func_ios_base_ptr_ios_base_ptr *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_23c = (int)std::setprecision(2);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        (*(in_RDI->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x68])(local_274,in_RDI,2);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      if (in_RDI->printBasisMetric == 3) {
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        in_stack_fffffffffffffc90 =
             (cpp_dec_float<50U,_int,_void> *)
             soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                                (_func_ios_base_ptr_ios_base_ptr *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::setprecision(2);
        soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           (_Setprecision)(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        basis(in_RDI);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::getEstimatedCondition(this_00);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc90,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    in_RDI->displayLine = in_RDI->displayLine + 1;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_b0);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }